

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int cmfgkb_(int *lot,int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *im1,
           int *in1,double *ch,double *ch1,int *im2,int *in2,double *wa)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  int local_194;
  ulong local_150;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  ulong local_98;
  int local_40;
  
  uVar5 = *ido;
  iVar6 = *ip;
  uVar37 = ~(iVar6 * uVar5);
  iVar7 = *in1;
  uVar8 = *lid;
  iVar12 = iVar7 * 2;
  iVar35 = -3 - iVar12 * (uVar8 + 1);
  iVar33 = *l1;
  iVar9 = *in2;
  iVar29 = (uVar8 + 1) * iVar9 * -2 + -3;
  uVar25 = iVar6 + 1;
  iVar10 = *im1;
  lVar19 = (long)iVar10;
  lVar22 = ((long)*lot + -1) * lVar19;
  iVar42 = *im2;
  iVar11 = (int)lVar22;
  lVar20 = (long)(iVar11 + 1);
  if (0 < (int)uVar8) {
    bVar15 = -1 < iVar11;
    if (iVar10 < 0) {
      bVar15 = iVar11 < 1;
    }
    lVar38 = (ulong)uVar8 + 1;
    iVar26 = (int)lVar38;
    iVar30 = iVar7 * iVar26 * 2 + 2;
    iVar26 = iVar9 * iVar26 * 2 + 2;
    lVar48 = 1;
    do {
      lVar44 = lVar19 + 1;
      iVar16 = iVar30;
      iVar39 = iVar26;
      if (bVar15) {
        do {
          ch1[(long)iVar29 + (long)(iVar39 + 1)] = cc1[(long)iVar35 + (long)(iVar16 + 1)];
          ch1[(long)iVar29 + (long)iVar39 + 2] = cc1[(long)iVar35 + (long)iVar16 + 2];
          bVar13 = lVar44 <= lVar20;
          if (iVar10 < 0) {
            bVar13 = lVar22 < lVar44;
          }
          iVar16 = iVar16 + iVar10 * 2;
          lVar44 = lVar44 + lVar19;
          iVar39 = iVar39 + iVar42 * 2;
        } while (bVar13);
      }
      lVar48 = lVar48 + 1;
      iVar30 = iVar30 + iVar12;
      iVar26 = iVar26 + iVar9 * 2;
    } while (lVar48 != lVar38);
  }
  iVar30 = (iVar6 - ((int)uVar25 >> 0x1f)) + 1 >> 1;
  if (2 < iVar6) {
    bVar15 = -1 < iVar11;
    if (iVar10 < 0) {
      bVar15 = iVar11 < 1;
    }
    iVar26 = 2;
    if (2 < iVar30) {
      iVar26 = iVar30;
    }
    iVar39 = uVar8 * 2 + 1;
    iVar18 = iVar7 * iVar39 * 2;
    iVar16 = iVar6 * uVar8 + 1;
    local_194 = iVar7 * iVar16 * 2;
    iVar16 = iVar16 * iVar9 * 2 + 2;
    iVar39 = iVar39 * iVar9 * 2 + 2;
    uVar23 = 2;
    do {
      if (0 < (int)uVar8) {
        uVar24 = 1;
        iVar40 = iVar18;
        iVar47 = local_194;
        iVar32 = iVar39;
        iVar45 = iVar16;
        do {
          if (bVar15) {
            iVar34 = 0;
            lVar22 = lVar19 + 1;
            iVar17 = iVar32;
            iVar31 = iVar45;
            do {
              lVar38 = (long)(iVar40 + iVar34 + 3);
              lVar48 = (long)(iVar47 + 3 + iVar34);
              ch1[(long)iVar29 + (long)(iVar17 + 1)] = cc1[iVar35 + lVar38] + cc1[iVar35 + lVar48];
              ch1[(long)iVar29 + (long)(iVar31 + 1)] = cc1[iVar35 + lVar38] - cc1[iVar35 + lVar48];
              lVar48 = (long)(iVar40 + 2 + iVar34);
              lVar38 = (long)(iVar47 + 2 + iVar34);
              ch1[(long)iVar29 + (long)iVar17 + 2] =
                   cc1[(long)iVar35 + lVar48 + 2] + cc1[(long)iVar35 + lVar38 + 2];
              bVar13 = lVar22 <= lVar20;
              if (iVar10 < 0) {
                bVar13 = iVar11 < lVar22;
              }
              ch1[(long)iVar29 + (long)iVar31 + 2] =
                   cc1[(long)iVar35 + lVar48 + 2] - cc1[(long)iVar35 + lVar38 + 2];
              iVar34 = iVar34 + iVar10 * 2;
              lVar22 = lVar22 + lVar19;
              iVar31 = iVar31 + iVar42 * 2;
              iVar17 = iVar17 + iVar42 * 2;
            } while (bVar13);
          }
          uVar24 = uVar24 + 1;
          iVar40 = iVar40 + iVar12;
          iVar47 = iVar47 + iVar12;
          iVar45 = iVar45 + iVar9 * 2;
          iVar32 = iVar32 + iVar9 * 2;
        } while (uVar24 != uVar8 + 1);
      }
      uVar23 = uVar23 + 1;
      iVar18 = iVar18 + iVar7 * uVar8 * 2;
      local_194 = local_194 + iVar7 * uVar8 * -2;
      iVar16 = iVar16 + iVar9 * uVar8 * -2;
      iVar39 = iVar39 + iVar9 * uVar8 * 2;
    } while (uVar23 != iVar26 + 1);
  }
  if (2 < iVar6) {
    bVar15 = -1 < iVar11;
    if (iVar10 < 0) {
      bVar15 = iVar11 < 1;
    }
    iVar26 = 2;
    if (2 < iVar30) {
      iVar26 = iVar30;
    }
    iVar16 = (uVar8 * 2 + 1) * iVar9 * 2 + 2;
    uVar23 = 2;
    do {
      if (0 < (int)uVar8) {
        uVar24 = 1;
        iVar39 = (uVar8 + 1) * iVar7 * 2 + 2;
        iVar18 = iVar16;
        do {
          lVar22 = lVar19 + 1;
          iVar32 = iVar39;
          iVar45 = iVar18;
          if (bVar15) {
            do {
              cc1[(long)iVar35 + (long)(iVar32 + 1)] =
                   ch1[(long)iVar29 + (long)(iVar45 + 1)] + cc1[(long)iVar35 + (long)(iVar32 + 1)];
              cc1[(long)iVar35 + (long)iVar32 + 2] =
                   ch1[(long)iVar29 + (long)iVar45 + 2] + cc1[(long)iVar35 + (long)iVar32 + 2];
              bVar13 = lVar22 <= lVar20;
              if (iVar10 < 0) {
                bVar13 = iVar11 < lVar22;
              }
              lVar22 = lVar22 + lVar19;
              iVar32 = iVar32 + iVar10 * 2;
              iVar45 = iVar45 + iVar42 * 2;
            } while (bVar13);
          }
          uVar24 = uVar24 + 1;
          iVar39 = iVar39 + iVar12;
          iVar18 = iVar18 + iVar9 * 2;
        } while (uVar24 != uVar8 + 1);
      }
      uVar23 = uVar23 + 1;
      iVar16 = iVar16 + uVar8 * iVar9 * 2;
    } while (uVar23 != iVar26 + 1);
  }
  lVar22 = (long)(int)uVar5;
  iVar26 = iVar6 + -1;
  if (2 < iVar6) {
    bVar15 = -1 < iVar11;
    if (iVar10 < 0) {
      bVar15 = iVar11 < 1;
    }
    bVar13 = -1 < iVar11;
    if (iVar10 < 0) {
      bVar13 = iVar11 < 1;
    }
    iVar16 = 3;
    if (3 < iVar30) {
      iVar16 = iVar30;
    }
    iVar39 = 2;
    if (2 < iVar30) {
      iVar39 = iVar30;
    }
    iVar45 = uVar8 * 2 + 1;
    local_9c = iVar7 * iVar45;
    local_a4 = local_9c * 2 + 2;
    local_9c = local_9c * 2;
    iVar17 = iVar7 * uVar8;
    iVar18 = iVar6 * uVar8 + 1;
    local_a0 = iVar7 * iVar18;
    local_a8 = local_a0 * 2 + 2;
    local_a0 = local_a0 * 2;
    iVar18 = iVar18 * iVar9 * 2;
    iVar45 = iVar45 * iVar9 * 2;
    iVar32 = (uVar8 + 1) * iVar9 * 2;
    iVar40 = iVar10 * 2;
    iVar47 = iVar9 * 2;
    iVar31 = iVar42 * 2;
    local_98 = 2;
    do {
      if (0 < (int)uVar8) {
        lVar48 = (local_98 + (long)iVar26 + -1) * lVar22;
        lVar38 = ((long)(iVar26 * 2) + local_98 + -1) * lVar22;
        uVar23 = 1;
        iVar21 = 0;
        iVar1 = local_a8;
        iVar34 = local_a4;
        do {
          lVar44 = lVar19 + 1;
          iVar46 = iVar1;
          iVar41 = iVar34;
          iVar27 = iVar21;
          if (bVar15) {
            do {
              cc1[(long)iVar35 + (long)(iVar41 + 1)] =
                   wa[(long)(int)uVar37 + lVar48 + 1] *
                   ch1[(long)iVar29 + (long)(iVar45 + 3 + iVar27)] +
                   ch1[(long)iVar29 + (long)(iVar32 + iVar27 + 3)];
              cc1[(long)iVar35 + (long)(iVar46 + 1)] =
                   wa[(long)(int)uVar37 + lVar38 + 1] *
                   ch1[(long)iVar29 + (long)(iVar18 + 3 + iVar27)];
              cc1[(long)iVar35 + (long)iVar41 + 2] =
                   wa[(long)(int)uVar37 + lVar48 + 1] *
                   ch1[(long)iVar29 + (long)(iVar45 + 2 + iVar27) + 2] +
                   ch1[(long)iVar29 + (long)(iVar32 + 2 + iVar27) + 2];
              bVar14 = lVar44 <= lVar20;
              if (iVar10 < 0) {
                bVar14 = iVar11 < lVar44;
              }
              cc1[(long)iVar35 + (long)iVar46 + 2] =
                   wa[(long)(int)uVar37 + lVar38 + 1] *
                   ch1[(long)iVar29 + (long)(iVar18 + 2 + iVar27) + 2];
              lVar44 = lVar44 + lVar19;
              iVar46 = iVar46 + iVar40;
              iVar41 = iVar41 + iVar40;
              iVar27 = iVar27 + iVar31;
            } while (bVar14);
          }
          uVar23 = uVar23 + 1;
          iVar34 = iVar34 + iVar12;
          iVar1 = iVar1 + iVar12;
          iVar21 = iVar21 + iVar47;
        } while (uVar23 != uVar8 + 1);
      }
      if (4 < iVar6) {
        local_40 = (int)local_98 + -1;
        uVar23 = 3;
        iVar1 = (uVar8 * 3 + 1) * iVar9 * 2 + 2;
        iVar34 = (uVar8 * iVar26 + 1) * iVar9 * 2 + 2;
        do {
          iVar21 = (((int)uVar23 + -1) * local_40) % iVar6;
          if (0 < (int)uVar8) {
            dVar2 = wa[(long)(int)uVar37 + (long)(int)((iVar26 + iVar21) * uVar5) + 1];
            dVar3 = wa[(long)(int)uVar37 + (long)(int)((iVar21 + iVar26 * 2) * uVar5) + 1];
            uVar24 = 1;
            iVar41 = local_9c;
            iVar27 = local_a0;
            iVar46 = iVar1;
            iVar21 = iVar34;
            do {
              if (bVar13) {
                iVar28 = 0;
                lVar38 = lVar19 + 1;
                iVar43 = iVar46;
                iVar36 = iVar21;
                do {
                  lVar48 = (long)(iVar41 + iVar28 + 3);
                  cc1[iVar35 + lVar48] =
                       ch1[(long)iVar29 + (long)(iVar43 + 1)] * dVar2 + cc1[iVar35 + lVar48];
                  lVar48 = (long)(iVar27 + 3 + iVar28);
                  cc1[iVar35 + lVar48] =
                       ch1[(long)iVar29 + (long)(iVar36 + 1)] * dVar3 + cc1[iVar35 + lVar48];
                  lVar48 = (long)(iVar41 + 2 + iVar28);
                  cc1[(long)iVar35 + lVar48 + 2] =
                       ch1[(long)iVar29 + (long)iVar43 + 2] * dVar2 + cc1[(long)iVar35 + lVar48 + 2]
                  ;
                  lVar48 = (long)(iVar27 + 2 + iVar28);
                  cc1[(long)iVar35 + lVar48 + 2] =
                       ch1[(long)iVar29 + (long)iVar36 + 2] * dVar3 + cc1[(long)iVar35 + lVar48 + 2]
                  ;
                  bVar14 = lVar38 <= lVar20;
                  if (iVar10 < 0) {
                    bVar14 = iVar11 < lVar38;
                  }
                  iVar28 = iVar28 + iVar40;
                  lVar38 = lVar38 + lVar19;
                  iVar36 = iVar36 + iVar31;
                  iVar43 = iVar43 + iVar31;
                } while (bVar14);
              }
              uVar24 = uVar24 + 1;
              iVar41 = iVar41 + iVar12;
              iVar27 = iVar27 + iVar12;
              iVar21 = iVar21 + iVar47;
              iVar46 = iVar46 + iVar47;
            } while (uVar24 != uVar8 + 1);
          }
          uVar23 = uVar23 + 1;
          iVar34 = iVar34 + iVar9 * uVar8 * -2;
          iVar1 = iVar1 + iVar9 * uVar8 * 2;
        } while (uVar23 != iVar16 + 1);
      }
      local_98 = local_98 + 1;
      local_a4 = local_a4 + iVar17 * 2;
      local_a8 = local_a8 + iVar17 * -2;
      local_9c = local_9c + iVar17 * 2;
      local_a0 = local_a0 + iVar17 * -2;
    } while (local_98 != iVar39 + 1);
  }
  if (((int)uVar5 < 2) && (*na != 1)) {
    if (2 < iVar6) {
      bVar15 = -1 < iVar11;
      if (iVar10 < 0) {
        bVar15 = iVar11 < 1;
      }
      iVar33 = 2;
      if (2 < iVar30) {
        iVar33 = iVar30;
      }
      iVar9 = (uVar8 * 2 + 1) * iVar7 * 2 + 2;
      iVar6 = (iVar6 * uVar8 + 1) * iVar7 * 2 + 3;
      uVar23 = 2;
      do {
        if (0 < (int)uVar8) {
          uVar24 = 1;
          iVar42 = iVar6;
          iVar29 = iVar9;
          do {
            lVar22 = lVar19 + 1;
            iVar30 = iVar29;
            iVar26 = iVar42;
            if (bVar15) {
              do {
                dVar2 = cc1[(long)iVar35 + (long)(iVar30 + 1)];
                dVar3 = cc1[(long)iVar35 + (long)(iVar26 + -1) + 2];
                cc1[(long)iVar35 + (long)(iVar30 + 1)] = dVar2 - dVar3;
                lVar38 = (long)iVar30;
                dVar4 = cc1[(long)iVar35 + (long)iVar26];
                cc1[(long)iVar35 + (long)(iVar26 + -1) + 2] = cc1[(long)iVar35 + lVar38 + 2] - dVar4
                ;
                cc1[(long)iVar35 + lVar38 + 2] = dVar4 + cc1[(long)iVar35 + lVar38 + 2];
                cc1[(long)iVar35 + (long)iVar26] = dVar2 + dVar3;
                bVar13 = lVar22 <= lVar20;
                if (iVar10 < 0) {
                  bVar13 = iVar11 < lVar22;
                }
                lVar22 = lVar22 + lVar19;
                iVar30 = iVar30 + iVar10 * 2;
                iVar26 = iVar26 + iVar10 * 2;
              } while (bVar13);
            }
            uVar24 = uVar24 + 1;
            iVar29 = iVar29 + iVar12;
            iVar42 = iVar42 + iVar12;
          } while (uVar24 != uVar8 + 1);
        }
        uVar23 = uVar23 + 1;
        iVar9 = iVar9 + uVar8 * iVar7 * 2;
        iVar6 = iVar6 + uVar8 * iVar7 * -2;
      } while (uVar23 != iVar33 + 1);
    }
  }
  else {
    if (0 < (int)uVar8) {
      bVar15 = -1 < iVar11;
      if (iVar10 < 0) {
        bVar15 = iVar11 < 1;
      }
      lVar38 = (ulong)uVar8 + 1;
      iVar39 = (int)lVar38;
      iVar16 = iVar7 * iVar39 * 2 + 2;
      iVar39 = iVar9 * iVar39 * 2 + 2;
      lVar48 = 1;
      do {
        lVar44 = lVar19 + 1;
        iVar18 = iVar39;
        iVar45 = iVar16;
        if (bVar15) {
          do {
            ch1[(long)iVar29 + (long)(iVar18 + 1)] = cc1[(long)iVar35 + (long)(iVar45 + 1)];
            ch1[(long)iVar29 + (long)iVar18 + 2] = cc1[(long)iVar35 + (long)iVar45 + 2];
            bVar13 = lVar44 <= lVar20;
            if (iVar10 < 0) {
              bVar13 = iVar11 < lVar44;
            }
            iVar45 = iVar45 + iVar10 * 2;
            lVar44 = lVar44 + lVar19;
            iVar18 = iVar18 + iVar42 * 2;
          } while (bVar13);
        }
        lVar48 = lVar48 + 1;
        iVar16 = iVar16 + iVar12;
        iVar39 = iVar39 + iVar9 * 2;
      } while (lVar48 != lVar38);
    }
    if (2 < iVar6) {
      bVar15 = -1 < iVar11;
      if (iVar10 < 0) {
        bVar15 = iVar11 < 1;
      }
      iVar16 = 2;
      if (2 < iVar30) {
        iVar16 = iVar30;
      }
      iVar39 = uVar8 * 2 + 1;
      iVar18 = iVar7 * iVar39 * 2;
      iVar30 = iVar6 * uVar8 + 1;
      local_194 = iVar7 * iVar30 * 2;
      iVar30 = iVar30 * iVar9 * 2 + 2;
      iVar39 = iVar39 * iVar9 * 2 + 2;
      uVar23 = 2;
      do {
        if (0 < (int)uVar8) {
          uVar24 = 1;
          iVar40 = iVar18;
          iVar47 = local_194;
          iVar32 = iVar39;
          iVar45 = iVar30;
          do {
            if (bVar15) {
              iVar34 = 0;
              lVar38 = lVar19 + 1;
              iVar31 = iVar32;
              iVar17 = iVar45;
              do {
                lVar48 = (long)(iVar40 + iVar34 + 3);
                lVar44 = (long)(iVar47 + 2 + iVar34);
                ch1[(long)iVar29 + (long)(iVar31 + 1)] =
                     cc1[iVar35 + lVar48] - cc1[(long)iVar35 + lVar44 + 2];
                ch1[(long)iVar29 + (long)(iVar17 + 1)] =
                     cc1[iVar35 + lVar48] + cc1[(long)iVar35 + lVar44 + 2];
                lVar48 = (long)(iVar40 + 2 + iVar34);
                lVar44 = (long)(iVar47 + 3 + iVar34);
                ch1[(long)iVar29 + (long)iVar17 + 2] =
                     cc1[(long)iVar35 + lVar48 + 2] - cc1[iVar35 + lVar44];
                bVar13 = lVar38 <= lVar20;
                if (iVar10 < 0) {
                  bVar13 = iVar11 < lVar38;
                }
                ch1[(long)iVar29 + (long)iVar31 + 2] =
                     cc1[(long)iVar35 + lVar48 + 2] + cc1[iVar35 + lVar44];
                iVar34 = iVar34 + iVar10 * 2;
                lVar38 = lVar38 + lVar19;
                iVar17 = iVar17 + iVar42 * 2;
                iVar31 = iVar31 + iVar42 * 2;
              } while (bVar13);
            }
            uVar24 = uVar24 + 1;
            iVar40 = iVar40 + iVar12;
            iVar47 = iVar47 + iVar12;
            iVar45 = iVar45 + iVar9 * 2;
            iVar32 = iVar32 + iVar9 * 2;
          } while (uVar24 != uVar8 + 1);
        }
        uVar23 = uVar23 + 1;
        iVar18 = iVar18 + iVar7 * uVar8 * 2;
        local_194 = local_194 + iVar7 * uVar8 * -2;
        iVar30 = iVar30 + iVar9 * uVar8 * -2;
        iVar39 = iVar39 + iVar9 * uVar8 * 2;
      } while (uVar23 != iVar16 + 1);
    }
    if (uVar5 != 1) {
      iVar35 = ~(iVar33 * uVar25) * iVar12 + -3;
      iVar29 = ~(iVar33 * (uVar5 + 1)) * iVar9 * 2 + -3;
      if (0 < (int)uVar5) {
        bVar15 = -1 < iVar11;
        if (iVar10 < 0) {
          bVar15 = iVar11 < 1;
        }
        iVar30 = (iVar33 * uVar25 + 1) * iVar7 * 2 + 2;
        local_194 = ((int)((ulong)uVar5 + 1) * iVar33 + 1) * iVar9 * 2 + 2;
        lVar38 = 1;
        do {
          if (0 < iVar33) {
            uVar23 = 1;
            iVar16 = local_194;
            iVar39 = iVar30;
            do {
              lVar48 = lVar19 + 1;
              iVar18 = iVar16;
              iVar45 = iVar39;
              if (bVar15) {
                do {
                  cc[(long)iVar35 + (long)(iVar45 + 1)] = ch[(long)iVar29 + (long)(iVar18 + 1)];
                  cc[(long)iVar35 + (long)iVar45 + 2] = ch[(long)iVar29 + (long)iVar18 + 2];
                  bVar13 = lVar48 <= lVar20;
                  if (iVar10 < 0) {
                    bVar13 = iVar11 < lVar48;
                  }
                  lVar48 = lVar48 + lVar19;
                  iVar18 = iVar18 + iVar42 * 2;
                  iVar45 = iVar45 + iVar10 * 2;
                } while (bVar13);
              }
              uVar23 = uVar23 + 1;
              iVar39 = iVar39 + iVar12;
              iVar16 = iVar16 + iVar9 * 2;
            } while (uVar23 != iVar33 + 1);
          }
          lVar38 = lVar38 + 1;
          iVar30 = iVar30 + iVar7 * iVar33 * iVar6 * 2;
          local_194 = local_194 + iVar9 * iVar33 * 2;
        } while (lVar38 != (ulong)uVar5 + 1);
      }
      if (1 < iVar6) {
        bVar15 = -1 < iVar11;
        if (iVar10 < 0) {
          bVar15 = iVar11 < 1;
        }
        iVar30 = ((iVar6 + 2) * iVar33 + 1) * iVar7 * 2 + 2;
        local_194 = ((uVar5 * 2 + 1) * iVar33 + 1) * iVar9 * 2 + 2;
        uVar23 = 2;
        do {
          if (0 < iVar33) {
            uVar24 = 1;
            iVar16 = local_194;
            iVar39 = iVar30;
            do {
              lVar38 = lVar19 + 1;
              iVar18 = iVar16;
              iVar45 = iVar39;
              if (bVar15) {
                do {
                  cc[(long)iVar35 + (long)(iVar45 + 1)] = ch[(long)iVar29 + (long)(iVar18 + 1)];
                  cc[(long)iVar35 + (long)iVar45 + 2] = ch[(long)iVar29 + (long)iVar18 + 2];
                  bVar13 = lVar38 <= lVar20;
                  if (iVar10 < 0) {
                    bVar13 = iVar11 < lVar38;
                  }
                  lVar38 = lVar38 + lVar19;
                  iVar18 = iVar18 + iVar42 * 2;
                  iVar45 = iVar45 + iVar10 * 2;
                } while (bVar13);
              }
              uVar24 = uVar24 + 1;
              iVar39 = iVar39 + iVar12;
              iVar16 = iVar16 + iVar9 * 2;
            } while (uVar24 != iVar33 + 1);
          }
          uVar23 = uVar23 + 1;
          iVar30 = iVar30 + iVar7 * iVar33 * 2;
          local_194 = local_194 + iVar9 * iVar33 * uVar5 * 2;
        } while (uVar23 != uVar25);
      }
      if (1 < iVar6) {
        bVar15 = -1 < iVar11;
        if (iVar10 < 0) {
          bVar15 = iVar11 < 1;
        }
        iVar30 = ((iVar6 * 2 + 2) * iVar33 + 1) * iVar7 * 2 + 2;
        iVar16 = ((uVar5 * 2 + 2) * iVar33 + 1) * iVar9 * 2 + 2;
        local_150 = 2;
        do {
          if (1 < (int)uVar5) {
            lVar38 = ((long)iVar26 + local_150 + -1) * lVar22;
            lVar48 = ((long)(iVar26 * 2) + local_150 + -1) * lVar22;
            uVar23 = 2;
            iVar39 = iVar30;
            iVar18 = iVar16;
            do {
              if (0 < iVar33) {
                uVar24 = 1;
                iVar45 = iVar18;
                iVar32 = iVar39;
                do {
                  lVar44 = lVar19 + 1;
                  iVar40 = iVar45;
                  iVar47 = iVar32;
                  if (bVar15) {
                    do {
                      cc[(long)iVar35 + (long)(iVar47 + 1)] =
                           wa[(long)(int)uVar37 + lVar38 + uVar23] *
                           ch[(long)iVar29 + (long)(iVar40 + 1)] -
                           ch[(long)iVar29 + (long)iVar40 + 2] *
                           wa[(long)(int)uVar37 + lVar48 + uVar23];
                      bVar13 = lVar44 <= lVar20;
                      if (iVar10 < 0) {
                        bVar13 = iVar11 < lVar44;
                      }
                      cc[(long)iVar35 + (long)iVar47 + 2] =
                           wa[(long)(int)uVar37 + lVar38 + uVar23] *
                           ch[(long)iVar29 + (long)iVar40 + 2] +
                           wa[(long)(int)uVar37 + lVar48 + uVar23] *
                           ch[(long)iVar29 + (long)(iVar40 + 1)];
                      lVar44 = lVar44 + lVar19;
                      iVar40 = iVar40 + iVar42 * 2;
                      iVar47 = iVar47 + iVar10 * 2;
                    } while (bVar13);
                  }
                  uVar24 = uVar24 + 1;
                  iVar32 = iVar32 + iVar12;
                  iVar45 = iVar45 + iVar9 * 2;
                } while (uVar24 != iVar33 + 1);
              }
              uVar23 = uVar23 + 1;
              iVar39 = iVar39 + iVar7 * iVar33 * iVar6 * 2;
              iVar18 = iVar18 + iVar9 * iVar33 * 2;
            } while (uVar23 != uVar5 + 1);
          }
          local_150 = local_150 + 1;
          iVar30 = iVar30 + iVar7 * iVar33 * 2;
          iVar16 = iVar16 + iVar9 * iVar33 * uVar5 * 2;
        } while (local_150 != uVar25);
      }
    }
  }
  return 0;
}

Assistant:

int cmfgkb_(int *lot, int *ido, int *ip, int
	*l1, int *lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *im1,
	int *in1, fft_real_t *ch, fft_real_t *ch1, int *im2, int *in2, fft_real_t *
	wa)
{
    /* System generated locals */
    int ch_dim2, ch_dim3, ch_dim4, ch_offset, cc_dim2, cc_dim3, cc_dim4,
	    cc_offset, cc1_dim2, cc1_dim3, cc1_offset, ch1_dim2, ch1_dim3,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3, i__4,
	    i__5;

    /* Local variables */
     int i__, j, k, l, m1, m2, jc, lc, ki, m1d, m2s;
     fft_real_t wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim2 = *in1;
    cc1_dim3 = *lid;
    cc1_offset = 1 + 2 * (1 + cc1_dim2 * (1 + cc1_dim3));
    cc1 -= cc1_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ip;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch1_dim2 = *in2;
    ch1_dim3 = *lid;
    ch1_offset = 1 + 2 * (1 + ch1_dim2 * (1 + ch1_dim3));
    ch1 -= ch1_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_dim4 = *ido;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * (1 + ch_dim4)));
    ch -= ch_offset;

    /* Function Body */
    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	m2 = m2s;
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    m2 += *im2;
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 1];
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 2];
/* L110: */
	}
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
/* L112: */
	    }
	}
/* L111: */
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	i__4 = *lid;
	for (ki = 1; ki <= i__4; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__2) {
		m2 += *im2;
		cc1[(m1 + (ki + cc1_dim3) * cc1_dim2 << 1) + 1] += ch1[(m2 + (
			ki + j * ch1_dim3) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + cc1_dim3) * cc1_dim2 << 1) + 2] += ch1[(m2 + (
			ki + j * ch1_dim3) * ch1_dim2 << 1) + 2];
/* L117: */
	    }
	}
/* L118: */
    }
    i__3 = ipph;
    for (l = 2; l <= i__3; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 1] = ch1[(m2
			+ (ki + ch1_dim3) * ch1_dim2 << 1) + 1] + wa[(l - 1 +
			wa_dim2) * wa_dim1 + 1] * ch1[(m2 + (ki + (ch1_dim3 <<
			 1)) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 1] = wa[(l
			- 1 + (wa_dim2 << 1)) * wa_dim1 + 1] * ch1[(m2 + (ki
			+ *ip * ch1_dim3) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 2] = ch1[(m2
			+ (ki + ch1_dim3) * ch1_dim2 << 1) + 2] + wa[(l - 1 +
			wa_dim2) * wa_dim1 + 1] * ch1[(m2 + (ki + (ch1_dim3 <<
			 1)) * ch1_dim2 << 1) + 2];
		cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 2] = wa[(l
			- 1 + (wa_dim2 << 1)) * wa_dim1 + 1] * ch1[(m2 + (ki
			+ *ip * ch1_dim3) * ch1_dim2 << 1) + 2];
/* L113: */
	    }
	}
	i__4 = ipph;
	for (j = 3; j <= i__4; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__1 = *lid;
	    for (ki = 1; ki <= i__1; ++ki) {
		m2 = m2s;
		i__2 = m1d;
		i__5 = *im1;
		for (m1 = 1; i__5 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__5) {
		    m2 += *im2;
		    cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 1] +=
			    war * ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 <<
			    1) + 1];
		    cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 1] +=
			    wai * ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 <<
			     1) + 1];
		    cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 2] +=
			    war * ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 <<
			    1) + 2];
		    cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 2] +=
			    wai * ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 <<
			     1) + 2];
/* L114: */
		}
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1 || *na == 1) {
	goto L136;
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	jc = ipp2 - j;
	i__4 = *lid;
	for (ki = 1; ki <= i__4; ++ki) {
	    i__5 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__5 : m1 <= i__5; m1 += i__2) {
		chold1 = cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1]
			- cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2]
			;
		chold2 = cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1]
			+ cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2]
			;
		cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] = chold1;
		cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] += cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1] = chold2;
/* L119: */
	    }
	}
/* L120: */
    }
    return 0;
L136:
    i__3 = *lid;
    for (ki = 1; ki <= i__3; ++ki) {
	m2 = m2s;
	i__2 = m1d;
	i__5 = *im1;
	for (m1 = 1; i__5 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__5) {
	    m2 += *im2;
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 1];
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 2];
/* L137: */
	}
    }
    i__5 = ipph;
    for (j = 2; j <= i__5; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] - cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] + cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
/* L134: */
	    }
	}
/* L135: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__5 = *ido;
    for (i__ = 1; i__ <= i__5; ++i__) {
	i__4 = *l1;
	for (k = 1; k <= i__4; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__2) {
		m2 += *im2;
		cc[(m1 + (k + (i__ * cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1)
			+ 1] = ch[(m2 + (k + (i__ + ch_dim4) * ch_dim3) *
			ch_dim2 << 1) + 1];
		cc[(m1 + (k + (i__ * cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1)
			+ 2] = ch[(m2 + (k + (i__ + ch_dim4) * ch_dim3) *
			ch_dim2 << 1) + 2];
/* L130: */
	    }
	}
/* L131: */
    }
    i__5 = *ip;
    for (j = 2; j <= i__5; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		cc[(m1 + (k + (j + cc_dim4) * cc_dim3) * cc_dim2 << 1) + 1] =
			ch[(m2 + (k + (j * ch_dim4 + 1) * ch_dim3) * ch_dim2
			<< 1) + 1];
		cc[(m1 + (k + (j + cc_dim4) * cc_dim3) * cc_dim2 << 1) + 2] =
			ch[(m2 + (k + (j * ch_dim4 + 1) * ch_dim3) * ch_dim2
			<< 1) + 2];
/* L122: */
	    }
	}
/* L123: */
    }
    i__5 = *ip;
    for (j = 2; j <= i__5; ++j) {
	i__4 = *ido;
	for (i__ = 2; i__ <= i__4; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		m2 = m2s;
		i__2 = m1d;
		i__1 = *im1;
		for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
		    m2 += *im2;
		    cc[(m1 + (k + (j + i__ * cc_dim4) * cc_dim3) * cc_dim2 <<
			    1) + 1] = wa[i__ + (j - 1 + wa_dim2) * wa_dim1] *
			    ch[(m2 + (k + (i__ + j * ch_dim4) * ch_dim3) *
			    ch_dim2 << 1) + 1] - wa[i__ + (j - 1 + (wa_dim2 <<
			     1)) * wa_dim1] * ch[(m2 + (k + (i__ + j *
			    ch_dim4) * ch_dim3) * ch_dim2 << 1) + 2];
		    cc[(m1 + (k + (j + i__ * cc_dim4) * cc_dim3) * cc_dim2 <<
			    1) + 2] = wa[i__ + (j - 1 + wa_dim2) * wa_dim1] *
			    ch[(m2 + (k + (i__ + j * ch_dim4) * ch_dim3) *
			    ch_dim2 << 1) + 2] + wa[i__ + (j - 1 + (wa_dim2 <<
			     1)) * wa_dim1] * ch[(m2 + (k + (i__ + j *
			    ch_dim4) * ch_dim3) * ch_dim2 << 1) + 1];
/* L124: */
		}
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}